

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O2

RecyclerTestObject * TrackedObject<1U,_50U>::New(void)

{
  uint uVar1;
  Recycler *alloc;
  TrackedObject<1U,_50U> *this;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  uVar1 = PAL_rand();
  data.typeinfo = (type_info *)(ulong)((uVar1 % 0x32) * 8 + 8);
  local_40 = (undefined1  [8])&TrackedObject<1u,50u>::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_424f;
  data.filename._0_4_ = 0x110;
  alloc = Memory::Recycler::TrackAllocInfo(recyclerInstance,(TrackAllocData *)local_40);
  this = (TrackedObject<1U,_50U> *)new<Memory::Recycler>(0x20,alloc,0x1e7930,0);
  TrackedObject(this,uVar1 % 0x32 + 1);
  return &this->super_RecyclerTestObject;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewTrackedLeafPlusZ(recyclerInstance, sizeof(RecyclerTestObject *) * count, TrackedObject, count);
    }